

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

BCReg expr_list(LexState *ls,ExpDesc *v)

{
  BCReg BVar1;
  
  expr_binop(ls,v,0);
  BVar1 = 1;
  while (ls->token == 0x2c) {
    lj_lex_next(ls);
    expr_tonextreg(ls->fs,v);
    expr_binop(ls,v,0);
    BVar1 = BVar1 + 1;
  }
  return BVar1;
}

Assistant:

static BCReg expr_list(LexState *ls, ExpDesc *v)
{
  BCReg n = 1;
  expr(ls, v);
  while (lex_opt(ls, ',')) {
    expr_tonextreg(ls->fs, v);
    expr(ls, v);
    n++;
  }
  return n;
}